

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O1

string * __thiscall
TokenScanner::nextToken_abi_cxx11_(string *__return_storage_ptr__,TokenScanner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringCell *pSVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  string *token;
  StringCell *cp;
  string local_70;
  string local_50;
  
  pSVar2 = this->savedTokens;
  if (pSVar2 == (StringCell *)0x0) {
LAB_001076eb:
    if (this->ignoreWhitespaceFlag == true) {
      skipSpaces(this);
    }
    iVar5 = std::istream::get();
    if ((iVar5 != 0x2f) || (iVar5 = 0x2f, this->ignoreCommentsFlag != true)) goto LAB_00107779;
    iVar6 = std::istream::get();
    if (iVar6 == 0x2a) {
      iVar5 = -1;
      do {
        iVar6 = std::istream::get();
        if (iVar6 == -1) break;
        bVar4 = iVar5 != 0x2a;
        iVar5 = iVar6;
      } while (iVar6 != 0x2f || bVar4);
      goto LAB_001076eb;
    }
    if (iVar6 == 0x2f) {
      do {
        do {
          iVar5 = std::istream::get();
        } while (0xe < iVar5 + 1U);
      } while ((0x4801U >> (iVar5 + 1U & 0x1f) & 1) == 0);
      goto LAB_001076eb;
    }
    if (iVar6 != -1) {
      std::istream::unget();
    }
LAB_00107779:
    if ((iVar5 == 0x27) || (iVar5 == 0x22)) {
      if (this->scanStringsFlag == true) {
        std::istream::unget();
        scanString_abi_cxx11_(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
    }
    else if (iVar5 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    if ((iVar5 - 0x30U < 10) && (this->scanNumbersFlag == true)) {
      std::istream::unget();
      scanNumber_abi_cxx11_(__return_storage_ptr__,this);
    }
    else {
      bVar4 = isWordCharacter(this,(char)iVar5);
      if (bVar4) {
        std::istream::unget();
        scanWord_abi_cxx11_(__return_storage_ptr__,this);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
        while( true ) {
          pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + __return_storage_ptr__->_M_string_length);
          bVar4 = isOperatorPrefix(this,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((!bVar4) || (iVar5 = std::istream::get(), iVar5 == -1)) break;
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        while( true ) {
          if (__return_storage_ptr__->_M_string_length < 2) {
            bVar4 = false;
          }
          else {
            pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar3,pcVar3 + __return_storage_ptr__->_M_string_length)
            ;
            bVar4 = isOperator(this,&local_50);
            bVar4 = !bVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          if (!bVar4) break;
          std::istream::unget();
          std::__cxx11::string::erase
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
        }
      }
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pSVar2->str)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pSVar2->str)._M_string_length);
    this->savedTokens = pSVar2->link;
    pcVar3 = (pSVar2->str)._M_dataplus._M_p;
    paVar1 = &(pSVar2->str).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pSVar2,0x28);
  }
  return __return_storage_ptr__;
}

Assistant:

string TokenScanner::nextToken() {
   if (savedTokens != NULL) {
      StringCell *cp = savedTokens;
      string token = cp->str;
      savedTokens = cp->link;
      delete cp;
      return token;
   }
   while (true) {
      if (ignoreWhitespaceFlag) skipSpaces();
      int ch = isp->get();
      if (ch == '/' && ignoreCommentsFlag) {
         ch = isp->get();
         if (ch == '/') {
            while (true) {
               ch = isp->get();
               if (ch == '\n' || ch == '\r' || ch == EOF) break;
            }
            continue;
         } else if (ch == '*') {
            int prev = EOF;
            while (true) {
               ch = isp->get();
               if (ch == EOF || (prev == '*' && ch == '/')) break;
               prev = ch;
            }
            continue;
         }
         if (ch != EOF) isp->unget();
         ch = '/';
      }
      if (ch == EOF) return "";
      if ((ch == '"' || ch == '\'') && scanStringsFlag) {
         isp->unget();
         return scanString();
      }
      if (isdigit(ch) && scanNumbersFlag) {
         isp->unget();
         return scanNumber();
      }
      if (isWordCharacter(ch)) {
         isp->unget();
         return scanWord();
      }
      string op = string(1, ch);
      while (isOperatorPrefix(op)) {
         ch = isp->get();
         if (ch == EOF) break;
         op += ch;
      }
      while (op.length() > 1 && !isOperator(op)) {
         isp->unget();
         op.erase(op.length() - 1, 1);
      }
      return op;
   }
}